

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false>::push_back
          (SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false> *this,LocationList *Elt
          )

{
  uint uVar1;
  
  uVar1 = (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
          super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
      super_SmallVectorBase.Capacity <= uVar1) {
    grow(this,0);
    uVar1 = (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
            super_SmallVectorBase.Size;
  }
  DWARFDebugLoc::LocationList::LocationList
            ((LocationList *)
             ((ulong)uVar1 * 0x68 +
             (long)(this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
                   super_SmallVectorBase.BeginX),Elt);
  SmallVectorBase::set_size
            ((SmallVectorBase *)this,
             (ulong)(this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>)
                    .super_SmallVectorBase.Size + 1);
  return;
}

Assistant:

void push_back(T &&Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void*) this->end()) T(::std::move(Elt));
    this->set_size(this->size() + 1);
  }